

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_ffx(void)

{
  int iVar1;
  int iVar2;
  ptls_cipher_context_t *ppVar3;
  ptls_cipher_context_t *ppVar4;
  ptls_cipher_context_t *ctx;
  bool local_81;
  bool local_75;
  int len;
  int bit_length;
  int i;
  uint8_t result [32];
  uint8_t encrypted [32];
  ptls_cipher_context_t *ffx_dec_bad;
  ptls_cipher_context_t *ffx_dec;
  ptls_cipher_context_t *ffx_enc;
  
  len = 0;
  while (ffx_variants[len].algo != (ptls_cipher_algorithm_t *)0x0) {
    ppVar3 = ptls_cipher_new(ffx_variants[len].algo,1,test_ffx::ffx_test_key);
    ppVar4 = ptls_cipher_new(ffx_variants[len].algo,0,test_ffx::ffx_test_key);
    ctx = ptls_cipher_new(ffx_variants[len].algo,0,test_ffx::ffx_test_bad_key);
    local_75 = false;
    if ((ppVar3 != (ptls_cipher_context_t *)0x0) &&
       (local_75 = false, ppVar4 != (ptls_cipher_context_t *)0x0)) {
      local_75 = ctx != (ptls_cipher_context_t *)0x0;
    }
    _ok((uint)local_75,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x154);
    if (((ppVar3 != (ptls_cipher_context_t *)0x0) && (ppVar4 != (ptls_cipher_context_t *)0x0)) &&
       (ctx != (ptls_cipher_context_t *)0x0)) {
      iVar2 = ffx_variants[len].bit_length;
      iVar1 = (iVar2 + 7) / 8;
      ptls_cipher_init(ppVar3,test_ffx::ffx_test_iv);
      ptls_cipher_encrypt(ppVar3,result + 0x18,test_ffx::ffx_test_source,(long)iVar1);
      _ok((uint)((result[(long)(iVar1 + -1) + 0x18] & test_ffx::ffx_test_mask[iVar2 % 8]) ==
                (test_ffx::ffx_test_source[iVar1 + -1] & test_ffx::ffx_test_mask[iVar2 % 8])),
          "%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
          0x15b);
      ptls_cipher_init(ppVar4,test_ffx::ffx_test_iv);
      ptls_cipher_encrypt(ppVar4,&bit_length,result + 0x18,(long)iVar1);
      iVar2 = memcmp(test_ffx::ffx_test_source,&bit_length,(long)iVar1);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x15f);
      ptls_cipher_init(ppVar4,test_ffx::ffx_test_bad_iv);
      ptls_cipher_encrypt(ppVar4,&bit_length,result + 0x18,(long)iVar1);
      iVar2 = memcmp(test_ffx::ffx_test_source,&bit_length,(long)iVar1);
      _ok((uint)(iVar2 != 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x163);
      ptls_cipher_init(ctx,test_ffx::ffx_test_iv);
      ptls_cipher_encrypt(ctx,&bit_length,result + 0x18,(long)iVar1);
      iVar2 = memcmp(test_ffx::ffx_test_source,&bit_length,(long)iVar1);
      _ok((uint)(iVar2 != 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x167);
    }
    if (ppVar3 != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(ppVar3);
    }
    if (ppVar4 != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(ppVar4);
    }
    if (ctx != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(ctx);
    }
    len = len + 1;
  }
  if (ffx_variants[2].bit_length == 0x35) {
    ppVar3 = ptls_ffx_new(&ptls_minicrypto_aes128ctr,1,4,0x35,test_ffx::ffx_test_key);
    ppVar4 = ptls_cipher_new(ffx_variants[2].algo,0,test_ffx::ffx_test_key);
    local_81 = ppVar3 != (ptls_cipher_context_t *)0x0 && ppVar4 != (ptls_cipher_context_t *)0x0;
    _ok((uint)local_81,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x17b);
    if ((ppVar3 != (ptls_cipher_context_t *)0x0) && (ppVar4 != (ptls_cipher_context_t *)0x0)) {
      ptls_cipher_init(ppVar3,test_ffx::ffx_test_iv);
      ptls_cipher_encrypt(ppVar3,result + 0x18,test_ffx::ffx_test_source,7);
      ptls_cipher_init(ppVar4,test_ffx::ffx_test_iv);
      ptls_cipher_encrypt(ppVar4,&bit_length,result + 0x18,7);
      iVar2 = memcmp(test_ffx::ffx_test_source,&bit_length,7);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x181);
    }
    if (ppVar3 != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(ppVar3);
    }
    if (ppVar4 != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(ppVar4);
    }
    return;
  }
  __assert_fail("ffx_variants[2].bit_length == 53",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                0x178,"void test_ffx(void)");
}

Assistant:

static void test_ffx(void)
{
    static uint8_t ffx_test_source[32] = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'a', 'b', 'c', 'd', 'e', 'f',
                                          'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r', 's', 't', 'u', 'v'};

    static uint8_t ffx_test_key[32] = {1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15, 16,
                                       17, 18, 19, 20, 21, 22, 23, 24, 25, 27, 28, 29, 30, 31, 32};
    static uint8_t ffx_test_bad_key[32] = {0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15,
                                           16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 27, 28, 29, 30, 31};

    static uint8_t ffx_test_iv[16] = {10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25};
    static uint8_t ffx_test_bad_iv[16] = {11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26};

    static uint8_t ffx_test_mask[8] = {0x00, 0x01, 0x03, 0x07, 0x0F, 0x1F, 0x3F, 0x7F};
    ptls_cipher_context_t *ffx_enc = NULL;
    ptls_cipher_context_t *ffx_dec = NULL;
    ptls_cipher_context_t *ffx_dec_bad = NULL;
    uint8_t encrypted[32];
    uint8_t result[32];

    for (int i = 0; ffx_variants[i].algo != NULL; i++) {
        ffx_enc = ptls_cipher_new(ffx_variants[i].algo, 1, ffx_test_key);
        ffx_dec = ptls_cipher_new(ffx_variants[i].algo, 0, ffx_test_key);
        ffx_dec_bad = ptls_cipher_new(ffx_variants[i].algo, 0, ffx_test_bad_key);
        ok(ffx_enc != NULL && ffx_dec != NULL && ffx_dec_bad != NULL);
        if (ffx_enc != NULL && ffx_dec != NULL && ffx_dec_bad != NULL) {
            int bit_length = ffx_variants[i].bit_length;
            int len = (bit_length + 7) / 8;
            /* test that encoding works and last byte is correct */
            ptls_cipher_init(ffx_enc, ffx_test_iv);
            ptls_cipher_encrypt(ffx_enc, encrypted, ffx_test_source, len);
            ok((encrypted[len - 1] & ffx_test_mask[bit_length % 8]) == (ffx_test_source[len - 1] & ffx_test_mask[bit_length % 8]));
            /* Test that decoding with good key and IV works*/
            ptls_cipher_init(ffx_dec, ffx_test_iv);
            ptls_cipher_encrypt(ffx_dec, result, encrypted, len);
            ok(memcmp(ffx_test_source, result, len) == 0);
            /* Test that decoding with bad IV fails */
            ptls_cipher_init(ffx_dec, ffx_test_bad_iv);
            ptls_cipher_encrypt(ffx_dec, result, encrypted, len);
            ok(memcmp(ffx_test_source, result, len) != 0);
            /* Test that decoding with bad key fails */
            ptls_cipher_init(ffx_dec_bad, ffx_test_iv);
            ptls_cipher_encrypt(ffx_dec_bad, result, encrypted, len);
            ok(memcmp(ffx_test_source, result, len) != 0);
        }
        if (ffx_enc != NULL) {
            ptls_cipher_free(ffx_enc);
        }
        if (ffx_dec != NULL) {
            ptls_cipher_free(ffx_dec);
        }
        if (ffx_dec_bad != NULL) {
            ptls_cipher_free(ffx_dec_bad);
        }
    }

    /* Test the direct usage of the API with the "ptls_ffx_new" function.
     * The test verifies that ptls_ffx_new is compatible with
     * creating an ffx variant with the macro, then creating the cipher.
     */
    assert(ffx_variants[2].bit_length == 53); /* assumes that ffx_variants[0] is ffx_aes128ctr_b53_r4 */
    ffx_enc = ptls_ffx_new(&ptls_minicrypto_aes128ctr, 1, 4, 53, ffx_test_key);
    ffx_dec = ptls_cipher_new(ffx_variants[2].algo, 0, ffx_test_key);
    ok(ffx_enc != NULL && ffx_dec != NULL);
    if (ffx_enc != NULL && ffx_dec != NULL) {
        ptls_cipher_init(ffx_enc, ffx_test_iv);
        ptls_cipher_encrypt(ffx_enc, encrypted, ffx_test_source, 7);
        ptls_cipher_init(ffx_dec, ffx_test_iv);
        ptls_cipher_encrypt(ffx_dec, result, encrypted, 7);
        ok(memcmp(ffx_test_source, result, 7) == 0);
    }
    if (ffx_enc != NULL) {
        ptls_cipher_free(ffx_enc);
    }
    if (ffx_dec != NULL) {
        ptls_cipher_free(ffx_dec);
    }
}